

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEditPrivate::repaintContents(QTextEditPrivate *this,QRectF *contentsRect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QScrollBar *this_00;
  QWidgetData *pQVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  Representation RVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QRectF QStack_88;
  undefined1 local_68 [12];
  Representation RStack_5c;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((contentsRect->w <= 0.0) || (contentsRect->h <= 0.0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
      return;
    }
  }
  else {
    LVar6 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    this_00 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar6 == RightToLeft) {
      iVar7 = QAbstractSlider::maximum(&this_00->super_QAbstractSlider);
      iVar8 = QAbstractSlider::value
                        (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
      iVar7 = iVar7 - iVar8;
    }
    else {
      iVar7 = QAbstractSlider::value(&this_00->super_QAbstractSlider);
    }
    iVar8 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    local_58 = (double)iVar7;
    dStack_50 = (double)iVar8;
    pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    uVar1 = (pQVar5->crect).x2;
    uVar3 = (pQVar5->crect).y2;
    uVar2 = (pQVar5->crect).x1;
    uVar4 = (pQVar5->crect).y1;
    local_48 = (double)((uVar1 - uVar2) + 1);
    dStack_40 = (double)((uVar3 - uVar4) + 1);
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
    QRectF::operator&(&QStack_88,contentsRect);
    _local_68 = (QRect)QRectF::toAlignedRect();
    RVar9 = local_68._0_4_;
    RVar10 = local_68._8_4_;
    if ((int)local_68._4_4_ <= RStack_5c.m_i && RVar9.m_i <= RVar10.m_i) {
      local_68._4_4_ = local_68._4_4_ - iVar8;
      local_68._0_4_ = RVar9.m_i - iVar7;
      RStack_5c.m_i = RStack_5c.m_i - iVar8;
      local_68._8_4_ = RVar10.m_i - iVar7;
      QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport,(QRect *)local_68);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::repaintContents(const QRectF &contentsRect)
{
    if (!contentsRect.isValid()) {
        viewport->update();
        return;
    }
    const int xOffset = horizontalOffset();
    const int yOffset = verticalOffset();
    const QRectF visibleRect(xOffset, yOffset, viewport->width(), viewport->height());

    QRect r = contentsRect.intersected(visibleRect).toAlignedRect();
    if (r.isEmpty())
        return;

    r.translate(-xOffset, -yOffset);
    viewport->update(r);
}